

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O2

void aom_lpf_horizontal_8_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  undefined4 uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  byte bVar17;
  byte bVar18;
  byte bVar19;
  unkuint9 Var20;
  undefined1 auVar21 [11];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  unkuint9 Var24;
  undefined1 auVar25 [11];
  unkuint9 Var26;
  undefined1 auVar27 [11];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [13];
  undefined1 auVar31 [11];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  long lVar44;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar45 [16];
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ulong uVar65;
  undefined1 auVar66 [16];
  byte bVar67;
  byte bVar69;
  byte bVar75;
  char cVar76;
  byte bVar79;
  char cVar80;
  byte bVar81;
  byte bVar83;
  char cVar84;
  uint uVar70;
  undefined4 uVar71;
  byte bVar73;
  byte bVar77;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  char cVar88;
  byte bVar89;
  byte bVar90;
  char cVar91;
  byte bVar92;
  byte bVar93;
  char cVar94;
  byte bVar96;
  byte bVar97;
  char cVar98;
  short sVar95;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  undefined1 auVar72 [16];
  byte bVar109;
  byte bVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  byte bVar121;
  byte bVar125;
  short sVar122;
  short sVar123;
  byte bVar126;
  byte bVar131;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  short sVar136;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  byte bVar141;
  byte bVar142;
  byte bVar143;
  byte bVar144;
  byte bVar145;
  byte bVar146;
  undefined1 auVar124 [16];
  undefined4 uVar147;
  short sVar148;
  short sVar149;
  undefined4 uVar150;
  short sVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  ulong uVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  byte bVar178;
  short sVar175;
  short sVar179;
  short sVar180;
  byte bVar183;
  short sVar181;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar184 [16];
  ushort uVar186;
  short sVar188;
  short sVar189;
  short sVar190;
  undefined1 auVar187 [16];
  byte bVar68;
  byte bVar74;
  byte bVar78;
  byte bVar82;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  undefined1 uVar169;
  undefined1 uVar170;
  undefined1 uVar171;
  undefined1 uVar172;
  undefined1 uVar173;
  undefined1 uVar174;
  short sVar182;
  undefined1 auVar185 [16];
  
  uVar1 = *(undefined4 *)(s + -(long)(p * 4));
  lVar44 = (long)p;
  uVar2 = *(uint *)(s + lVar44 * -3);
  auVar111 = ZEXT416(uVar2);
  uVar3 = *(undefined4 *)(s + lVar44 * -2);
  uVar4 = *(undefined4 *)(s + -lVar44);
  uVar5 = *(undefined4 *)s;
  uVar6 = *(undefined4 *)(s + lVar44);
  uVar71 = *(undefined4 *)(s + lVar44 * 2);
  auVar112._4_4_ = uVar71;
  auVar112._0_4_ = uVar2;
  auVar112._8_8_ = 0;
  auVar187._4_4_ = uVar6;
  auVar187._0_4_ = uVar3;
  auVar187._8_8_ = 0;
  auVar176._0_8_ = CONCAT44(uVar5,uVar4);
  auVar176._8_8_ = 0;
  auVar185._8_4_ = uVar5;
  auVar185._0_8_ = auVar176._0_8_;
  auVar185._12_4_ = uVar6;
  auVar184._8_8_ = auVar185._8_8_;
  auVar184._4_4_ = uVar3;
  auVar184._0_4_ = uVar4;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = auVar184._8_8_;
  auVar72 = psubusb(auVar187,auVar176);
  auVar45 = psubusb(auVar176,auVar187);
  auVar45 = auVar45 | auVar72;
  auVar72 = psubusb(auVar184,auVar66);
  auVar152 = psubusb(auVar66,auVar184);
  auVar152 = auVar152 | auVar72;
  bVar8 = auVar45[0];
  bVar68 = auVar45[4];
  bVar67 = (bVar68 < bVar8) * bVar8 | (bVar68 >= bVar8) * bVar68;
  bVar9 = auVar45[1];
  bVar74 = auVar45[5];
  bVar73 = (bVar74 < bVar9) * bVar9 | (bVar74 >= bVar9) * bVar74;
  bVar10 = auVar45[2];
  bVar78 = auVar45[6];
  bVar77 = (bVar78 < bVar10) * bVar10 | (bVar78 >= bVar10) * bVar78;
  bVar11 = auVar45[3];
  bVar82 = auVar45[7];
  bVar81 = (bVar82 < bVar11) * bVar11 | (bVar82 >= bVar11) * bVar82;
  bVar87 = auVar45[8];
  bVar85 = (bVar87 < bVar68) * bVar68 | (bVar87 >= bVar68) * bVar87;
  bVar100 = auVar45[9];
  bVar89 = (bVar100 < bVar74) * bVar74 | (bVar100 >= bVar74) * bVar100;
  bVar144 = auVar45[10];
  bVar92 = (bVar144 < bVar78) * bVar78 | (bVar144 >= bVar78) * bVar144;
  bVar146 = auVar45[0xb];
  bVar96 = (bVar146 < bVar82) * bVar82 | (bVar146 >= bVar82) * bVar146;
  bVar105 = *_thresh;
  bVar110 = _thresh[1];
  bVar178 = _thresh[2];
  bVar108 = _thresh[3];
  bVar183 = _thresh[4];
  bVar17 = _thresh[5];
  bVar18 = _thresh[6];
  bVar19 = _thresh[7];
  uVar70 = CONCAT13(-((byte)((bVar81 < bVar108) * bVar81 | (bVar81 >= bVar108) * bVar108) == bVar81)
                    ,CONCAT12(-((byte)((bVar77 < bVar178) * bVar77 | (bVar77 >= bVar178) * bVar178)
                               == bVar77),
                              CONCAT11(-((byte)((bVar73 < bVar110) * bVar73 |
                                               (bVar73 >= bVar110) * bVar110) == bVar73),
                                       -((byte)((bVar67 < bVar105) * bVar67 |
                                               (bVar67 >= bVar105) * bVar105) == bVar67))));
  auVar72 = paddusb(auVar152,auVar152);
  auVar165._0_2_ = auVar152._4_2_ >> 1;
  auVar165._2_2_ = auVar152._6_2_ >> 1;
  auVar165._4_2_ = auVar152._8_2_ >> 1;
  auVar165._6_2_ = auVar152._10_2_ >> 1;
  auVar165._8_2_ = auVar152._12_2_ >> 1;
  auVar165._10_2_ = auVar152._14_2_ >> 1;
  auVar165._12_4_ = 0;
  auVar124 = paddusb(auVar165 & _DAT_00465160,auVar72);
  auVar72 = psubusb(auVar112,auVar187);
  auVar152 = psubusb(auVar187,auVar112);
  auVar152 = auVar152 | auVar72;
  uVar7 = *(undefined4 *)(s + lVar44 * 3);
  auVar155._0_8_ = CONCAT44(uVar7,uVar1);
  auVar155._8_8_ = 0;
  auVar72 = psubusb(auVar112,auVar155);
  auVar187 = psubusb(auVar155,auVar112);
  auVar72 = auVar72 | auVar187;
  bVar105 = auVar152[0];
  bVar110 = auVar72[0];
  bVar69 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[1];
  bVar110 = auVar72[1];
  bVar75 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[2];
  bVar110 = auVar72[2];
  bVar79 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[3];
  bVar110 = auVar72[3];
  bVar83 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[4];
  bVar110 = auVar72[4];
  bVar86 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[5];
  bVar110 = auVar72[5];
  bVar90 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[6];
  bVar110 = auVar72[6];
  bVar93 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[7];
  bVar110 = auVar72[7];
  bVar97 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[8];
  bVar110 = auVar72[8];
  bVar99 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[9];
  bVar110 = auVar72[9];
  bVar101 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[10];
  bVar110 = auVar72[10];
  bVar102 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[0xb];
  bVar110 = auVar72[0xb];
  bVar103 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[0xc];
  bVar110 = auVar72[0xc];
  bVar104 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[0xd];
  bVar110 = auVar72[0xd];
  bVar106 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[0xe];
  bVar110 = auVar72[0xe];
  bVar178 = auVar72[0xf];
  bVar107 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar152[0xf];
  bVar109 = (bVar178 < bVar105) * bVar105 | (bVar178 >= bVar105) * bVar178;
  auVar72 = psubusb(auVar124,*(undefined1 (*) [16])_blimit);
  bVar105 = -(auVar72[0] == '\0') ^ 0xff;
  bVar110 = -(auVar72[1] == '\0') ^ 0xff;
  bVar178 = -(auVar72[2] == '\0') ^ 0xff;
  bVar108 = -(auVar72[3] == '\0') ^ 0xff;
  bVar67 = -(auVar72[4] == '\0') ^ 0xff;
  bVar77 = -(auVar72[5] == '\0') ^ 0xff;
  bVar143 = -(auVar72[6] == '\0') ^ 0xff;
  bVar145 = -(auVar72[7] == '\0') ^ 0xff;
  bVar121 = (bVar105 < bVar8) * bVar8 | (bVar105 >= bVar8) * bVar105;
  bVar125 = (bVar110 < bVar9) * bVar9 | (bVar110 >= bVar9) * bVar110;
  bVar126 = (bVar178 < bVar10) * bVar10 | (bVar178 >= bVar10) * bVar178;
  bVar131 = (bVar108 < bVar11) * bVar11 | (bVar108 >= bVar11) * bVar108;
  bVar110 = (bVar68 != 0) * bVar68;
  bVar105 = (bVar74 != 0) * bVar74;
  bVar81 = (bVar78 != 0) * bVar78;
  bVar73 = (bVar82 != 0) * bVar82;
  bVar141 = (bVar67 < bVar87) * bVar87 | (bVar67 >= bVar87) * bVar67;
  bVar142 = (bVar77 < bVar100) * bVar100 | (bVar77 >= bVar100) * bVar77;
  bVar144 = (bVar143 < bVar144) * bVar144 | (bVar143 >= bVar144) * bVar143;
  bVar146 = (bVar145 < bVar146) * bVar146 | (bVar145 >= bVar146) * bVar145;
  bVar77 = (auVar45[0xc] != '\0') * auVar45[0xc];
  bVar67 = (auVar45[0xd] != '\0') * auVar45[0xd];
  bVar108 = (auVar45[0xe] != '\0') * auVar45[0xe];
  bVar178 = (auVar45[0xf] != '\0') * auVar45[0xf];
  bVar69 = (bVar69 < bVar121) * bVar121 | (bVar69 >= bVar121) * bVar69;
  bVar75 = (bVar75 < bVar125) * bVar125 | (bVar75 >= bVar125) * bVar75;
  bVar79 = (bVar79 < bVar126) * bVar126 | (bVar79 >= bVar126) * bVar79;
  bVar83 = (bVar83 < bVar131) * bVar131 | (bVar83 >= bVar131) * bVar83;
  bVar87 = (bVar86 < bVar110) * bVar110 | (bVar86 >= bVar110) * bVar86;
  bVar86 = (bVar90 < bVar105) * bVar105 | (bVar90 >= bVar105) * bVar90;
  bVar81 = (bVar93 < bVar81) * bVar81 | (bVar93 >= bVar81) * bVar93;
  bVar73 = (bVar97 < bVar73) * bVar73 | (bVar97 >= bVar73) * bVar97;
  bVar100 = (bVar99 < bVar141) * bVar141 | (bVar99 >= bVar141) * bVar99;
  bVar90 = (bVar101 < bVar142) * bVar142 | (bVar101 >= bVar142) * bVar101;
  bVar144 = (bVar102 < bVar144) * bVar144 | (bVar102 >= bVar144) * bVar102;
  bVar93 = (bVar103 < bVar146) * bVar146 | (bVar103 >= bVar146) * bVar103;
  bVar105 = (bVar104 < bVar77) * bVar77 | (bVar104 >= bVar77) * bVar104;
  bVar67 = (bVar106 < bVar67) * bVar67 | (bVar106 >= bVar67) * bVar106;
  bVar108 = (bVar107 < bVar108) * bVar108 | (bVar107 >= bVar108) * bVar107;
  bVar110 = (bVar109 < bVar178) * bVar178 | (bVar109 >= bVar178) * bVar109;
  bVar99 = (bVar87 < bVar69) * bVar69 | (bVar87 >= bVar69) * bVar87;
  bVar101 = (bVar86 < bVar75) * bVar75 | (bVar86 >= bVar75) * bVar86;
  bVar102 = (bVar81 < bVar79) * bVar79 | (bVar81 >= bVar79) * bVar81;
  bVar103 = (bVar73 < bVar83) * bVar83 | (bVar73 >= bVar83) * bVar73;
  bVar104 = (bVar100 < bVar87) * bVar87 | (bVar100 >= bVar87) * bVar100;
  bVar106 = (bVar90 < bVar86) * bVar86 | (bVar90 >= bVar86) * bVar90;
  bVar107 = (bVar144 < bVar81) * bVar81 | (bVar144 >= bVar81) * bVar144;
  bVar109 = (bVar93 < bVar73) * bVar73 | (bVar93 >= bVar73) * bVar93;
  bVar121 = (bVar105 < bVar100) * bVar100 | (bVar105 >= bVar100) * bVar105;
  bVar125 = (bVar67 < bVar90) * bVar90 | (bVar67 >= bVar90) * bVar67;
  bVar126 = (bVar108 < bVar144) * bVar144 | (bVar108 >= bVar144) * bVar108;
  bVar131 = (bVar110 < bVar93) * bVar93 | (bVar110 >= bVar93) * bVar110;
  bVar105 = (bVar105 != 0) * bVar105;
  bVar67 = (bVar67 != 0) * bVar67;
  bVar108 = (bVar108 != 0) * bVar108;
  bVar110 = (bVar110 != 0) * bVar110;
  bVar178 = *_limit;
  bVar73 = _limit[1];
  bVar77 = _limit[2];
  bVar81 = _limit[3];
  bVar69 = _limit[4];
  bVar75 = _limit[5];
  bVar79 = _limit[6];
  bVar83 = _limit[7];
  bVar87 = _limit[8];
  bVar86 = _limit[9];
  bVar100 = _limit[10];
  bVar90 = _limit[0xb];
  bVar144 = _limit[0xc];
  bVar93 = _limit[0xd];
  bVar146 = _limit[0xe];
  bVar97 = _limit[0xf];
  auVar124._0_4_ =
       CONCAT13(-((byte)((bVar103 < bVar81) * bVar103 | (bVar103 >= bVar81) * bVar81) == bVar103),
                CONCAT12(-((byte)((bVar102 < bVar77) * bVar102 | (bVar102 >= bVar77) * bVar77) ==
                          bVar102),
                         CONCAT11(-((byte)((bVar101 < bVar73) * bVar101 |
                                          (bVar101 >= bVar73) * bVar73) == bVar101),
                                  -((byte)((bVar99 < bVar178) * bVar99 |
                                          (bVar99 >= bVar178) * bVar178) == bVar99))));
  auVar124[4] = -((byte)((bVar104 < bVar69) * bVar104 | (bVar104 >= bVar69) * bVar69) == bVar104);
  auVar124[5] = -((byte)((bVar106 < bVar75) * bVar106 | (bVar106 >= bVar75) * bVar75) == bVar106);
  auVar124[6] = -((byte)((bVar107 < bVar79) * bVar107 | (bVar107 >= bVar79) * bVar79) == bVar107);
  auVar124[7] = -((byte)((bVar109 < bVar83) * bVar109 | (bVar109 >= bVar83) * bVar83) == bVar109);
  auVar124[8] = -((byte)((bVar121 < bVar87) * bVar121 | (bVar121 >= bVar87) * bVar87) == bVar121);
  auVar124[9] = -((byte)((bVar125 < bVar86) * bVar125 | (bVar125 >= bVar86) * bVar86) == bVar125);
  auVar124[10] = -((byte)((bVar126 < bVar100) * bVar126 | (bVar126 >= bVar100) * bVar100) == bVar126
                  );
  auVar124[0xb] = -((byte)((bVar131 < bVar90) * bVar131 | (bVar131 >= bVar90) * bVar90) == bVar131);
  auVar124[0xc] =
       -((byte)((bVar105 < bVar144) * bVar105 | (bVar105 >= bVar144) * bVar144) == bVar105);
  auVar124[0xd] = -((byte)((bVar67 < bVar93) * bVar67 | (bVar67 >= bVar93) * bVar93) == bVar67);
  auVar124[0xe] =
       -((byte)((bVar108 < bVar146) * bVar108 | (bVar108 >= bVar146) * bVar146) == bVar108);
  auVar124[0xf] = -((byte)((bVar110 < bVar97) * bVar110 | (bVar110 >= bVar97) * bVar97) == bVar110);
  auVar45 = psubsb(auVar184 ^ _DAT_004645b0,auVar66 ^ _DAT_004645b0);
  uVar147 = (undefined4)
            (CONCAT17(-((byte)((bVar96 < bVar19) * bVar96 | (bVar96 >= bVar19) * bVar19) == bVar96),
                      CONCAT16(-((byte)((bVar92 < bVar18) * bVar92 | (bVar92 >= bVar18) * bVar18) ==
                                bVar92),CONCAT15(-((byte)((bVar89 < bVar17) * bVar89 |
                                                         (bVar89 >= bVar17) * bVar17) == bVar89),
                                                 CONCAT14(-((byte)((bVar85 < bVar183) * bVar85 |
                                                                  (bVar85 >= bVar183) * bVar183) ==
                                                           bVar85),uVar70)))) >> 0x20);
  auVar177._4_4_ = uVar70;
  auVar177._0_4_ = uVar70;
  auVar177._8_4_ = uVar147;
  auVar177._12_4_ = uVar147;
  auVar72 = psubsb(~auVar177 & auVar45 >> 0x20,auVar45);
  auVar72 = psubsb(auVar72,auVar45);
  auVar45 = psubsb(auVar72,auVar45);
  uVar147 = SUB164(auVar45 & auVar124,0);
  uVar150 = SUB164(auVar45 & auVar124,4);
  auVar72._4_4_ = uVar147;
  auVar72._0_4_ = uVar147;
  auVar72._8_4_ = uVar150;
  auVar72._12_4_ = uVar150;
  auVar45 = paddsb(auVar72,_DAT_00465150);
  auVar72 = psubusb(auVar112,auVar176);
  auVar187 = psubusb(auVar155,auVar176);
  auVar177 = psubusb(auVar176,auVar155);
  uVar174 = (undefined1)((uint)uVar7 >> 0x18);
  auVar164._8_6_ = 0;
  auVar164._0_8_ = auVar155._0_8_;
  auVar164[0xe] = uVar174;
  auVar164[0xf] = auVar45[7];
  auVar163._14_2_ = auVar164._14_2_;
  auVar163._8_5_ = 0;
  auVar163._0_8_ = auVar155._0_8_;
  auVar163[0xd] = auVar45[6];
  uVar173 = (undefined1)((uint)uVar7 >> 0x10);
  auVar162._13_3_ = auVar163._13_3_;
  auVar162._8_4_ = 0;
  auVar162._0_8_ = auVar155._0_8_;
  auVar162[0xc] = uVar173;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._8_3_ = 0;
  auVar161._0_8_ = auVar155._0_8_;
  auVar161[0xb] = auVar45[5];
  uVar172 = (undefined1)((uint)uVar7 >> 8);
  auVar160._11_5_ = auVar161._11_5_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = auVar155._0_8_;
  auVar160[10] = uVar172;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159[8] = 0;
  auVar159._0_8_ = auVar155._0_8_;
  auVar159[9] = auVar45[4];
  auVar158._9_7_ = auVar159._9_7_;
  auVar158[8] = (char)uVar7;
  auVar158._0_8_ = auVar155._0_8_;
  auVar157._8_8_ = auVar158._8_8_;
  auVar157[7] = auVar45[3];
  uVar171 = (undefined1)((uint)uVar1 >> 0x18);
  auVar157[6] = uVar171;
  auVar157[5] = auVar45[2];
  uVar170 = (undefined1)((uint)uVar1 >> 0x10);
  auVar157[4] = uVar170;
  auVar157._0_4_ = uVar1;
  auVar156._4_12_ = auVar157._4_12_;
  auVar156[3] = auVar45[1];
  uVar169 = (undefined1)((uint)uVar1 >> 8);
  auVar156[2] = uVar169;
  auVar156[0] = (byte)uVar1;
  auVar156[1] = auVar45[0];
  auVar45 = psraw(auVar156,0xb);
  auVar165 = packsswb(auVar45,auVar45);
  auVar152[0] = auVar165[0] + '\x01';
  cVar76 = auVar165[1] + '\x01';
  cVar80 = auVar165[2] + '\x01';
  cVar84 = auVar165[3] + '\x01';
  cVar88 = auVar165[4] + '\x01';
  cVar91 = auVar165[5] + '\x01';
  cVar94 = auVar165[6] + '\x01';
  cVar98 = auVar165[7] + '\x01';
  auVar152._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar98,cVar98),cVar94),cVar94
                                                    ),cVar91),cVar91),cVar88),
                 CONCAT11(cVar88,cVar98)) >> 8);
  auVar152[7] = cVar84;
  auVar152[6] = cVar84;
  auVar152[5] = cVar80;
  auVar152[4] = cVar80;
  auVar152[3] = cVar76;
  auVar152[2] = cVar76;
  auVar152[1] = auVar152[0];
  auVar45 = psraw(auVar152,9);
  auVar45 = packsswb(auVar45,auVar45);
  uVar70 = auVar45._0_4_ & uVar70;
  auVar167._0_8_ = auVar165._0_8_;
  auVar167._8_4_ = auVar165._4_4_;
  auVar167._12_4_ = uVar70;
  auVar166._8_8_ = auVar167._8_8_;
  auVar166._0_4_ = auVar165._0_4_;
  auVar166._4_4_ = uVar70;
  auVar45 = psubsb(auVar66 ^ _DAT_004645b0,auVar166);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = auVar166._8_8_;
  auVar66 = paddsb(auVar168,auVar184 ^ _DAT_004645b0);
  uVar65 = auVar45._0_8_ ^ (ulong)DAT_004645b0;
  uVar154 = auVar66._0_8_ ^ (ulong)DAT_004645b0;
  auVar45 = psubusb(auVar176,auVar112);
  auVar45 = auVar45 | auVar72;
  auVar177 = auVar177 | auVar187;
  bVar105 = auVar45[0];
  bVar110 = auVar177[0];
  bVar110 = (bVar110 < bVar105) * bVar105 | (bVar110 >= bVar105) * bVar110;
  bVar105 = auVar45[1];
  bVar178 = auVar177[1];
  bVar178 = (bVar178 < bVar105) * bVar105 | (bVar178 >= bVar105) * bVar178;
  bVar105 = auVar45[2];
  bVar108 = auVar177[2];
  bVar108 = (bVar108 < bVar105) * bVar105 | (bVar108 >= bVar105) * bVar108;
  bVar105 = auVar45[3];
  bVar67 = auVar177[3];
  bVar67 = (bVar67 < bVar105) * bVar105 | (bVar67 >= bVar105) * bVar67;
  bVar105 = auVar45[4];
  bVar73 = auVar177[4];
  bVar73 = (bVar73 < bVar105) * bVar105 | (bVar73 >= bVar105) * bVar73;
  bVar105 = auVar45[5];
  bVar77 = auVar177[5];
  bVar77 = (bVar77 < bVar105) * bVar105 | (bVar77 >= bVar105) * bVar77;
  bVar105 = auVar45[6];
  bVar81 = auVar177[6];
  bVar81 = (bVar81 < bVar105) * bVar105 | (bVar81 >= bVar105) * bVar81;
  bVar105 = auVar45[7];
  bVar183 = auVar177[7];
  bVar183 = (bVar183 < bVar105) * bVar105 | (bVar183 >= bVar105) * bVar183;
  bVar105 = (bVar110 < bVar8) * bVar8 | (bVar110 >= bVar8) * bVar110;
  bVar110 = (bVar178 < bVar9) * bVar9 | (bVar178 >= bVar9) * bVar178;
  bVar178 = (bVar108 < bVar10) * bVar10 | (bVar108 >= bVar10) * bVar108;
  bVar108 = (bVar67 < bVar11) * bVar11 | (bVar67 >= bVar11) * bVar67;
  bVar67 = (bVar73 < bVar68) * bVar68 | (bVar73 >= bVar68) * bVar73;
  bVar73 = (bVar77 < bVar74) * bVar74 | (bVar77 >= bVar74) * bVar77;
  bVar77 = (bVar81 < bVar78) * bVar78 | (bVar81 >= bVar78) * bVar81;
  bVar81 = (bVar183 < bVar82) * bVar82 | (bVar183 >= bVar82) * bVar183;
  bVar105 = (bVar67 < bVar105) * bVar105 | (bVar67 >= bVar105) * bVar67;
  bVar110 = (bVar73 < bVar110) * bVar110 | (bVar73 >= bVar110) * bVar73;
  bVar178 = (bVar77 < bVar178) * bVar178 | (bVar77 >= bVar178) * bVar77;
  bVar108 = (bVar81 < bVar108) * bVar108 | (bVar81 >= bVar108) * bVar81;
  uVar70 = CONCAT13(-((byte)((bVar108 == 0) * bVar108 | bVar108 != 0) == bVar108),
                    CONCAT12(-((byte)((bVar178 == 0) * bVar178 | bVar178 != 0) == bVar178),
                             CONCAT11(-((byte)((bVar110 == 0) * bVar110 | bVar110 != 0) == bVar110),
                                      -((byte)((bVar105 == 0) * bVar105 | bVar105 != 0) == bVar105))
                            )) & auVar124._0_4_;
  auVar153._0_8_ = CONCAT44(uVar70,uVar70);
  auVar153._8_4_ = uVar70;
  auVar153._12_4_ = uVar70;
  cVar76 = (char)uVar70;
  auVar45[0] = -(cVar76 == '\0');
  cVar80 = (char)(uVar70 >> 8);
  auVar45[1] = -(cVar80 == '\0');
  cVar84 = (char)(uVar70 >> 0x10);
  auVar45[2] = -(cVar84 == '\0');
  cVar88 = (char)(uVar70 >> 0x18);
  auVar45[3] = -(cVar88 == '\0');
  auVar45[4] = -(cVar76 == '\0');
  auVar45[5] = -(cVar80 == '\0');
  auVar45[6] = -(cVar84 == '\0');
  auVar45[7] = -(cVar88 == '\0');
  auVar45[8] = -(cVar76 == '\0');
  auVar45[9] = -(cVar80 == '\0');
  auVar45[10] = -(cVar84 == '\0');
  auVar45[0xb] = -(cVar88 == '\0');
  auVar45[0xc] = -(cVar76 == '\0');
  auVar45[0xd] = -(cVar80 == '\0');
  auVar45[0xe] = -(cVar84 == '\0');
  auVar45[0xf] = -(cVar88 == '\0');
  if ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) | (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe | (ushort)(auVar45[0xf] >> 7) << 0xf)
      != 0xffff) {
    Var20 = CONCAT81(SUB158(ZEXT815(0),7),(char)(uVar2 >> 0x18));
    auVar32._9_6_ = 0;
    auVar32._0_9_ = Var20;
    auVar21._1_10_ = SUB1510(auVar32 << 0x30,5);
    auVar21[0] = (char)(uVar2 >> 0x10);
    auVar33._11_4_ = 0;
    auVar33._0_11_ = auVar21;
    auVar12[2] = (char)(uVar2 >> 8);
    auVar12._0_2_ = (ushort)uVar2;
    auVar12._3_12_ = SUB1512(auVar33 << 0x20,3);
    uVar119 = (ushort)uVar2 & 0xff;
    Var22 = CONCAT81(SUB158(ZEXT815(0),7),(char)((uint)uVar3 >> 0x18));
    auVar34._9_6_ = 0;
    auVar34._0_9_ = Var22;
    auVar23._1_10_ = SUB1510(auVar34 << 0x30,5);
    auVar23[0] = (char)((uint)uVar3 >> 0x10);
    auVar35._11_4_ = 0;
    auVar35._0_11_ = auVar23;
    auVar13[2] = (char)((uint)uVar3 >> 8);
    auVar13._0_2_ = (ushort)uVar3;
    auVar13._3_12_ = SUB1512(auVar35 << 0x20,3);
    uVar118 = (ushort)uVar3 & 0xff;
    uVar50 = (ushort)(byte)((uint)uVar4 >> 8);
    uVar49 = (ushort)uVar4 & 0xff;
    uVar114 = (ushort)(byte)((uint)uVar5 >> 8);
    uVar113 = (ushort)uVar5 & 0xff;
    Var24 = CONCAT81(SUB158(ZEXT815(0),7),(char)((uint)uVar6 >> 0x18));
    auVar36._9_6_ = 0;
    auVar36._0_9_ = Var24;
    auVar25._1_10_ = SUB1510(auVar36 << 0x30,5);
    auVar25[0] = (char)((uint)uVar6 >> 0x10);
    auVar37._11_4_ = 0;
    auVar37._0_11_ = auVar25;
    auVar14[2] = (char)((uint)uVar6 >> 8);
    auVar14._0_2_ = (ushort)uVar6;
    auVar14._3_12_ = SUB1512(auVar37 << 0x20,3);
    uVar61 = (ushort)uVar6 & 0xff;
    Var26 = CONCAT81(SUB158(ZEXT815(0),7),(char)((uint)uVar71 >> 0x18));
    auVar38._9_6_ = 0;
    auVar38._0_9_ = Var26;
    auVar27._1_10_ = SUB1510(auVar38 << 0x30,5);
    auVar27[0] = (char)((uint)uVar71 >> 0x10);
    auVar39._11_4_ = 0;
    auVar39._0_11_ = auVar27;
    auVar15[2] = (char)((uint)uVar71 >> 8);
    auVar15._0_2_ = (ushort)uVar71;
    auVar15._3_12_ = SUB1512(auVar39 << 0x20,3);
    uVar117 = (ushort)uVar71 & 0xff;
    Var28 = CONCAT81(SUB158(ZEXT815(0),7),uVar171);
    auVar40._9_6_ = 0;
    auVar40._0_9_ = Var28;
    auVar29._1_10_ = SUB1510(auVar40 << 0x30,5);
    auVar29[0] = uVar170;
    auVar41._11_4_ = 0;
    auVar41._0_11_ = auVar29;
    auVar30._1_12_ = SUB1512(auVar41 << 0x20,3);
    auVar30[0] = uVar169;
    uVar120 = (ushort)auVar156[0];
    sVar46 = auVar30._0_2_;
    sVar47 = auVar29._0_2_;
    sVar48 = (short)Var28;
    sVar127 = auVar12._2_2_;
    sVar148 = auVar13._2_2_;
    sVar132 = auVar21._0_2_;
    sVar149 = auVar23._0_2_;
    sVar136 = (short)Var20;
    sVar151 = (short)Var22;
    uVar51 = (ushort)(byte)((uint)uVar4 >> 0x10);
    uVar52 = (ushort)(byte)((uint)uVar4 >> 0x18);
    sVar122 = uVar119 + uVar118 + uVar120 * 2 + uVar49 + 4;
    sVar128 = sVar127 + sVar148 + sVar46 * 2 + uVar50 + 4;
    sVar133 = sVar132 + sVar149 + sVar47 * 2 + uVar51 + 4;
    sVar137 = sVar136 + sVar151 + sVar48 * 2 + uVar52 + 4;
    Var20 = CONCAT81(SUB158(ZEXT815(0),7),uVar174);
    auVar42._9_6_ = 0;
    auVar42._0_9_ = Var20;
    auVar31._1_10_ = SUB1510(auVar42 << 0x30,5);
    auVar31[0] = uVar173;
    auVar43._11_4_ = 0;
    auVar43._0_11_ = auVar31;
    auVar16[2] = uVar172;
    auVar16._0_2_ = (ushort)uVar7;
    auVar16._3_12_ = SUB1512(auVar43 << 0x20,3);
    uVar186 = (ushort)uVar7 & 0xff;
    uVar115 = (ushort)(byte)((uint)uVar5 >> 0x10);
    uVar116 = (ushort)(byte)((uint)uVar5 >> 0x18);
    sVar175 = uVar61 + uVar113;
    sVar179 = auVar14._2_2_ + uVar114;
    sVar180 = auVar25._0_2_ + uVar115;
    sVar182 = (short)Var24;
    sVar181 = sVar182 + uVar116;
    sVar123 = (sVar122 - uVar120) + uVar117;
    sVar129 = (sVar128 - sVar46) + auVar15._2_2_;
    sVar134 = (sVar133 - sVar47) + auVar27._0_2_;
    sVar95 = (short)Var26;
    sVar138 = (sVar137 - sVar48) + sVar95;
    uVar49 = (ushort)(uVar49 + sVar175 + sVar123) >> 3;
    uVar50 = (ushort)(uVar50 + sVar179 + sVar129) >> 3;
    uVar51 = (ushort)(uVar51 + sVar180 + sVar134) >> 3;
    uVar52 = (ushort)(uVar52 + sVar181 + sVar138) >> 3;
    uVar53 = (ushort)(sVar175 + uVar118 + sVar122) >> 3;
    uVar54 = (ushort)(sVar179 + sVar148 + sVar128) >> 3;
    uVar55 = (ushort)(sVar180 + sVar149 + sVar133) >> 3;
    uVar56 = (ushort)(sVar181 + sVar151 + sVar137) >> 3;
    sVar123 = (sVar123 - uVar120) + uVar186;
    sVar188 = auVar16._2_2_;
    sVar130 = (sVar129 - sVar46) + sVar188;
    sVar189 = auVar31._0_2_;
    sVar135 = (sVar134 - sVar47) + sVar189;
    sVar190 = (short)Var20;
    sVar139 = (sVar138 - sVar48) + sVar190;
    sVar129 = (sVar123 - uVar119) + uVar186;
    sVar134 = (sVar130 - sVar127) + sVar188;
    sVar138 = (sVar135 - sVar132) + sVar189;
    sVar140 = (sVar139 - sVar136) + sVar190;
    uVar57 = (ushort)(uVar113 + sVar175 + sVar123) >> 3;
    uVar58 = (ushort)(uVar114 + sVar179 + sVar130) >> 3;
    uVar59 = (ushort)(uVar115 + sVar180 + sVar135) >> 3;
    uVar60 = (ushort)(uVar116 + sVar181 + sVar139) >> 3;
    uVar61 = (ushort)(uVar61 + sVar175 + sVar129) >> 3;
    uVar62 = (ushort)(auVar14._2_2_ + sVar179 + sVar134) >> 3;
    uVar63 = (ushort)(auVar25._0_2_ + sVar180 + sVar138) >> 3;
    uVar64 = (ushort)(sVar182 + sVar181 + sVar140) >> 3;
    uVar113 = (ushort)(uVar119 + uVar120 + uVar113 + sVar122) >> 3;
    uVar114 = (ushort)(sVar127 + sVar46 + uVar114 + sVar128) >> 3;
    uVar115 = (ushort)(sVar132 + sVar47 + uVar115 + sVar133) >> 3;
    uVar116 = (ushort)(sVar136 + sVar48 + uVar116 + sVar137) >> 3;
    uVar117 = (ushort)(sVar175 + uVar186 + (uVar117 - uVar118) + sVar129) >> 3;
    uVar118 = (ushort)(sVar179 + sVar188 + (auVar15._2_2_ - sVar148) + sVar134) >> 3;
    uVar119 = (ushort)(sVar180 + sVar189 + (auVar27._0_2_ - sVar149) + sVar138) >> 3;
    uVar120 = (ushort)(sVar181 + sVar190 + (sVar95 - sVar151) + sVar140) >> 3;
    auVar111[1] = (uVar114 != 0) * (uVar114 < 0x100) * (char)uVar114 - (0xff < uVar114);
    auVar111[0] = (uVar113 != 0) * (uVar113 < 0x100) * (char)uVar113 - (0xff < uVar113);
    auVar111[2] = (uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115);
    auVar111[3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116);
    auVar111[4] = (uVar117 != 0) * (uVar117 < 0x100) * (char)uVar117 - (0xff < uVar117);
    auVar111[5] = (uVar118 != 0) * (uVar118 < 0x100) * (char)uVar118 - (0xff < uVar118);
    auVar111[6] = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
    auVar111[7] = (uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120);
    auVar111[8] = (uVar113 != 0) * (uVar113 < 0x100) * (char)uVar113 - (0xff < uVar113);
    auVar111[9] = (uVar114 != 0) * (uVar114 < 0x100) * (char)uVar114 - (0xff < uVar114);
    auVar111[10] = (uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115);
    auVar111[0xb] = (uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116);
    auVar111[0xc] = (uVar117 != 0) * (uVar117 < 0x100) * (char)uVar117 - (0xff < uVar117);
    auVar111[0xd] = (uVar118 != 0) * (uVar118 < 0x100) * (char)uVar118 - (0xff < uVar118);
    auVar111[0xe] = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
    auVar111[0xf] = (uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120);
    auVar111 = auVar111 & auVar153 | ~auVar153 & auVar112;
    uVar71 = auVar111._4_4_;
    uVar65 = CONCAT17((uVar64 != 0) * (uVar64 < 0x100) * (char)uVar64 - (0xff < uVar64),
                      CONCAT16((uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63),
                               CONCAT15((uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 -
                                        (0xff < uVar62),
                                        CONCAT14((uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 -
                                                 (0xff < uVar61),
                                                 CONCAT13((uVar60 != 0) * (uVar60 < 0x100) *
                                                          (char)uVar60 - (0xff < uVar60),
                                                          CONCAT12((uVar59 != 0) * (uVar59 < 0x100)
                                                                   * (char)uVar59 - (0xff < uVar59),
                                                                   CONCAT11((uVar58 != 0) *
                                                                            (uVar58 < 0x100) *
                                                                            (char)uVar58 -
                                                                            (0xff < uVar58),
                                                                            (uVar57 != 0) *
                                                                            (uVar57 < 0x100) *
                                                                            (char)uVar57 -
                                                                            (0xff < uVar57)))))))) &
             auVar153._0_8_ | ~auVar153._0_8_ & uVar65;
    uVar154 = CONCAT17((uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56),
                       CONCAT16((uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55),
                                CONCAT15((uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 -
                                         (0xff < uVar54),
                                         CONCAT14((uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 -
                                                  (0xff < uVar53),
                                                  CONCAT13((uVar52 != 0) * (uVar52 < 0x100) *
                                                           (char)uVar52 - (0xff < uVar52),
                                                           CONCAT12((uVar51 != 0) * (uVar51 < 0x100)
                                                                    * (char)uVar51 - (0xff < uVar51)
                                                                    ,CONCAT11((uVar50 != 0) *
                                                                              (uVar50 < 0x100) *
                                                                              (char)uVar50 -
                                                                              (0xff < uVar50),
                                                                              (uVar49 != 0) *
                                                                              (uVar49 < 0x100) *
                                                                              (char)uVar49 -
                                                                              (0xff < uVar49))))))))
              & auVar153._0_8_ | ~auVar153._0_8_ & uVar154;
  }
  *(int *)(s + -lVar44) = (int)uVar154;
  *(int *)(s + lVar44 * -2) = (int)(uVar154 >> 0x20);
  *(int *)s = (int)uVar65;
  *(int *)(s + lVar44) = (int)(uVar65 >> 0x20);
  *(int *)(s + lVar44 * -3) = auVar111._0_4_;
  *(undefined4 *)(s + lVar44 * 2) = uVar71;
  return;
}

Assistant:

void aom_lpf_horizontal_8_sse2(unsigned char *s, int p,
                               const unsigned char *_blimit,
                               const unsigned char *_limit,
                               const unsigned char *_thresh) {
  __m128i p3, p2, p1, p0, q0, q1, q2, q3;
  __m128i q1q0, p1p0;
  __m128i blimit = _mm_load_si128((const __m128i *)_blimit);
  __m128i limit = _mm_load_si128((const __m128i *)_limit);
  __m128i thresh = _mm_load_si128((const __m128i *)_thresh);

  p3 = xx_loadl_32(s - 4 * p);
  p2 = xx_loadl_32(s - 3 * p);
  p1 = xx_loadl_32(s - 2 * p);
  p0 = xx_loadl_32(s - 1 * p);
  q0 = xx_loadl_32(s - 0 * p);
  q1 = xx_loadl_32(s + 1 * p);
  q2 = xx_loadl_32(s + 2 * p);
  q3 = xx_loadl_32(s + 3 * p);

  lpf_internal_8_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0, &q1q0, &p1p0,
                      &blimit, &limit, &thresh);

  xx_storel_32(s - 1 * p, p1p0);
  xx_storel_32(s - 2 * p, _mm_srli_si128(p1p0, 4));
  xx_storel_32(s + 0 * p, q1q0);
  xx_storel_32(s + 1 * p, _mm_srli_si128(q1q0, 4));
  xx_storel_32(s - 3 * p, p2);
  xx_storel_32(s + 2 * p, q2);
}